

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

void Curl_cookie_loadfiles(Curl_easy *data)

{
  CookieInfo *pCVar1;
  curl_slist *pcVar2;
  
  pcVar2 = (data->change).cookielist;
  if (pcVar2 != (curl_slist *)0x0) {
    Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
    do {
      pCVar1 = Curl_cookie_init(data,pcVar2->data,data->cookies,
                                SUB41((*(uint *)&(data->set).field_0x910 & 0x20) >> 5,0));
      if (pCVar1 == (CookieInfo *)0x0) {
        Curl_infof(data,"ignoring failed cookie_init for %s\n",pcVar2->data);
      }
      else {
        data->cookies = pCVar1;
      }
      pcVar2 = pcVar2->next;
    } while (pcVar2 != (curl_slist *)0x0);
    curl_slist_free_all((data->change).cookielist);
    (data->change).cookielist = (curl_slist *)0x0;
    Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
    return;
  }
  return;
}

Assistant:

void Curl_cookie_loadfiles(struct Curl_easy *data)
{
  struct curl_slist *list = data->change.cookielist;
  if(list) {
    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
    while(list) {
      struct CookieInfo *newcookies = Curl_cookie_init(data,
                                        list->data,
                                        data->cookies,
                                        data->set.cookiesession);
      if(!newcookies)
        /* Failure may be due to OOM or a bad cookie; both are ignored
         * but only the first should be
         */
        infof(data, "ignoring failed cookie_init for %s\n", list->data);
      else
        data->cookies = newcookies;
      list = list->next;
    }
    curl_slist_free_all(data->change.cookielist); /* clean up list */
    data->change.cookielist = NULL; /* don't do this again! */
    Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
  }
}